

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ossl_bio_cf_in_read(BIO *bio,char *buf,int blen)

{
  void *pvVar1;
  undefined8 *puVar2;
  curl_trc_feat *pcVar3;
  int iVar4;
  CURLcode CVar5;
  Curl_cfilter *cf;
  CURLcode result;
  CURLcode local_44;
  ssize_t local_40;
  Curl_easy *local_38;
  
  cf = (Curl_cfilter *)BIO_get_data();
  pvVar1 = cf->ctx;
  if (cf == (Curl_cfilter *)0x0) {
    local_38 = (Curl_easy *)0x0;
  }
  else {
    local_38 = *(Curl_easy **)((long)pvVar1 + 0x38);
  }
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x30);
  local_44 = CURLE_RECV_ERROR;
  if (blen < 0 || buf == (char *)0x0) {
    return 0;
  }
  local_40 = Curl_conn_cf_recv(cf->next,local_38,buf,(ulong)(uint)blen,&local_44);
  if ((local_38 != (Curl_easy *)0x0) && (((local_38->set).field_0x8cd & 0x10) != 0)) {
    pcVar3 = (local_38->state).feat;
    if (pcVar3 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_0016ea7e;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar3->log_level < 1)) goto LAB_0016ea7e;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(local_38,cf,"ossl_bio_cf_in_read(len=%d) -> %d, err=%d",(ulong)(uint)blen,
                        local_40,(ulong)local_44);
    }
  }
LAB_0016ea7e:
  BIO_clear_flags((BIO *)bio,0xf);
  *(CURLcode *)(puVar2 + 4) = local_44;
  if (local_40 < 0) {
    if (local_44 == CURLE_AGAIN) {
      BIO_set_flags((BIO *)bio,9);
    }
  }
  else if (local_40 == 0) {
    *(byte *)((long)pvVar1 + 0x5c) = *(byte *)((long)pvVar1 + 0x5c) | 2;
  }
  iVar4 = (int)local_40;
  if ((*(byte *)((long)puVar2 + 0x25) & 1) == 0) {
    CVar5 = Curl_ssl_setup_x509_store(cf,local_38,(SSL_CTX *)*puVar2);
    if (CVar5 == CURLE_OK) {
      *(byte *)((long)puVar2 + 0x25) = *(byte *)((long)puVar2 + 0x25) | 1;
      iVar4 = (int)local_40;
    }
    else {
      *(CURLcode *)(puVar2 + 4) = CVar5;
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

static int ossl_bio_cf_in_read(BIO *bio, char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nread;
  CURLcode result = CURLE_RECV_ERROR;

  DEBUGASSERT(data);
  /* OpenSSL catches this case, so should we. */
  if(!buf)
    return 0;
  if(blen < 0)
    return 0;

  nread = Curl_conn_cf_recv(cf->next, data, buf, (size_t)blen, &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_in_read(len=%d) -> %d, err=%d",
              blen, (int)nread, result);
  BIO_clear_retry_flags(bio);
  octx->io_result = result;
  if(nread < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_read(bio);
  }
  else if(nread == 0) {
    connssl->peer_closed = TRUE;
  }

  /* Before returning server replies to the SSL instance, we need
   * to have setup the x509 store or verification will fail. */
  if(!octx->x509_store_setup) {
    result = Curl_ssl_setup_x509_store(cf, data, octx->ssl_ctx);
    if(result) {
      octx->io_result = result;
      return -1;
    }
    octx->x509_store_setup = TRUE;
  }

  return (int)nread;
}